

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::addColsInterface
          (Highs *this,HighsInt ext_num_new_col,double *ext_col_cost,double *ext_col_lower,
          double *ext_col_upper,HighsInt ext_num_new_nz,HighsInt *ext_a_start,HighsInt *ext_a_index,
          double *ext_a_value)

{
  vector<double,_std::allocator<double>_> *this_00;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  HighsInt HVar2;
  int iVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  pointer piVar6;
  bool bVar7;
  HighsStatus HVar8;
  HighsStatus call_status;
  HighsStatus HVar9;
  ulong uVar10;
  char *format;
  Highs *pHVar11;
  size_type __new_size;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  vector<double,_std::allocator<double>_> local_colUpper;
  vector<double,_std::allocator<double>_> local_colLower;
  vector<double,_std::allocator<double>_> local_colCost;
  HighsIndexCollection index_collection;
  allocator_type local_372;
  bool local_371;
  Highs *local_370;
  string local_368;
  HighsLogOptions *local_340;
  ulong local_338;
  HighsLp *local_330;
  undefined1 local_328 [16];
  vector<int,_std::allocator<int>_> local_318 [2];
  pointer local_2e8;
  pointer piStack_2e0;
  pointer piStack_2d8;
  pointer local_2d0;
  pointer pdStack_2c8;
  pointer pdStack_2c0;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_2b8;
  vector<double,_std::allocator<double>_> local_2b0;
  vector<double,_std::allocator<double>_> local_298;
  vector<double,_std::allocator<double>_> local_280;
  void **local_268;
  long local_260;
  HighsIndexCollection local_258;
  string local_208;
  string local_1e8;
  HighsLogOptions local_1c8;
  HighsLogOptions local_168;
  HighsLogOptions local_108;
  HighsSparseMatrix local_a0;
  long lVar16;
  
  if ((ext_num_new_nz | ext_num_new_col) < 0) {
    return kError;
  }
  if (ext_num_new_col == 0) {
    return kOk;
  }
  local_340 = &(this->options_).super_HighsOptionsStruct.log_options;
  local_370 = this;
  bVar7 = isColDataNull(local_340,ext_col_cost,ext_col_lower,ext_col_upper);
  if (bVar7) {
    return kError;
  }
  if ((ext_num_new_nz != 0) &&
     (bVar7 = isMatrixDataNull(local_340,ext_a_start,ext_a_index,ext_a_value), bVar7)) {
    return kError;
  }
  if ((ext_num_new_nz != 0) && ((local_370->model_).lp_.num_row_ < 1)) {
    return kError;
  }
  local_330 = &(local_370->model_).lp_;
  local_260 = (long)(((HighsModel *)local_330)->lp_).num_col_;
  local_258.is_set_ = false;
  local_258.set_num_entries_ = -1;
  local_258.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_258.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_258.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_258._41_8_ = 0;
  local_258.is_interval_ = true;
  local_258._8_8_ = (ulong)(ext_num_new_col - 1) << 0x20;
  uVar10 = (ulong)(uint)ext_num_new_col;
  local_258.dimension_ = ext_num_new_col;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_280,ext_col_cost,ext_col_cost + uVar10,
             (allocator_type *)local_328);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_298,ext_col_lower,
             ext_col_lower + uVar10,(allocator_type *)local_328);
  local_338 = uVar10;
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_2b0,ext_col_upper,
             ext_col_upper + uVar10,(allocator_type *)local_328);
  pHVar11 = local_370;
  local_371 = false;
  local_108.log_stream = local_340->log_stream;
  local_108.output_flag = local_340->output_flag;
  local_108.log_to_console = local_340->log_to_console;
  local_108.log_dev_level = local_340->log_dev_level;
  local_108.user_log_callback = local_340->user_log_callback;
  local_108.user_log_callback_data = local_340->user_log_callback_data;
  pfVar1 = &local_108.user_callback;
  local_2b8 = &(local_370->options_).super_HighsOptionsStruct.log_options.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(pfVar1,local_2b8);
  local_108.user_callback_active =
       (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_108.user_callback_data =
       (pHVar11->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  HVar8 = assessCosts(&pHVar11->options_,(pHVar11->model_).lp_.num_col_,&local_258,&local_280,
                      &local_371,(pHVar11->options_).super_HighsOptionsStruct.infinite_cost);
  local_328._0_8_ = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"assessCosts","");
  HVar8 = interpretCallStatus(&local_108,HVar8,kOk,(string *)local_328);
  if ((vector<int,_std::allocator<int>_> *)local_328._0_8_ != local_318) {
    operator_delete((void *)local_328._0_8_);
  }
  if (local_108.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_108.user_callback.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  HVar9 = kError;
  if (HVar8 == kError) goto LAB_0023072c;
  local_1c8.log_stream = local_340->log_stream;
  local_1c8.output_flag = local_340->output_flag;
  local_1c8.log_to_console = local_340->log_to_console;
  local_1c8.log_dev_level = local_340->log_dev_level;
  local_1c8.user_log_callback = local_340->user_log_callback;
  local_1c8.user_log_callback_data = local_340->user_log_callback_data;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(&local_1c8.user_callback,local_2b8);
  local_268 = &(local_370->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_1c8.user_callback_active =
       (local_370->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_1c8.user_callback_data = *local_268;
  call_status = assessBounds(&pHVar11->options_,"Col",(local_370->model_).lp_.num_col_,&local_258,
                             &local_298,&local_2b0,
                             (local_370->options_).super_HighsOptionsStruct.infinite_bound,
                             (HighsVarType *)0x0);
  local_328._0_8_ = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"assessBounds","");
  HVar8 = interpretCallStatus(&local_1c8,call_status,HVar8,(string *)local_328);
  if ((vector<int,_std::allocator<int>_> *)local_328._0_8_ != local_318) {
    operator_delete((void *)local_328._0_8_);
  }
  pHVar11 = local_370;
  if (local_1c8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1c8.user_callback.super__Function_base._M_manager)
              ((_Any_data *)&local_1c8.user_callback,(_Any_data *)&local_1c8.user_callback,
               __destroy_functor);
  }
  if (HVar8 == kError) goto LAB_0023072c;
  HVar2 = (pHVar11->model_).lp_.user_bound_scale_;
  if (HVar2 != 0) {
    bVar7 = boundScaleOk(&local_298,&local_2b0,HVar2,
                         (pHVar11->options_).super_HighsOptionsStruct.infinite_bound);
    pHVar11 = local_370;
    if (bVar7) {
      dVar13 = ldexp(1.0,(local_370->model_).lp_.user_bound_scale_);
      if (0 < ext_num_new_col) {
        uVar10 = 0;
        do {
          local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] * dVar13;
          local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar10] * dVar13;
          uVar10 = uVar10 + 1;
        } while (local_338 != uVar10);
      }
      goto LAB_0023011f;
    }
    format = "User bound scaling yields infinite bound\n";
LAB_002304d4:
    highsLogUser(local_340,kError,format);
    goto LAB_0023072c;
  }
LAB_0023011f:
  HVar2 = (pHVar11->model_).lp_.user_cost_scale_;
  if (HVar2 != 0) {
    bVar7 = costScaleOk(&local_280,HVar2,(pHVar11->options_).super_HighsOptionsStruct.infinite_cost)
    ;
    if (!bVar7) {
      format = "User cost scaling yields infinite cost\n";
      goto LAB_002304d4;
    }
    dVar13 = ldexp(1.0,(local_370->model_).lp_.user_cost_scale_);
    if (0 < ext_num_new_col) {
      uVar10 = 0;
      do {
        local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] =
             local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10] * dVar13;
        uVar10 = uVar10 + 1;
      } while (local_338 != uVar10);
    }
  }
  appendColsToLpVectors(local_330,ext_num_new_col,&local_280,&local_298,&local_2b0);
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_328);
  pHVar11 = local_370;
  local_328._8_4_ = (local_370->model_).lp_.num_row_;
  local_328._4_4_ = ext_num_new_col;
  local_328._0_4_ = 1;
  if (ext_num_new_nz == 0) {
    local_368._M_dataplus._M_p = local_368._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (local_318,(ulong)(ext_num_new_col + 1),(value_type_conflict2 *)&local_368);
LAB_00230503:
    HighsSparseMatrix::HighsSparseMatrix(&local_a0,(HighsSparseMatrix *)local_328);
    HighsSparseMatrix::addCols(&(pHVar11->model_).lp_.a_matrix_,&local_a0,(int8_t *)0x0);
    HighsSparseMatrix::~HighsSparseMatrix(&local_a0);
    if ((pHVar11->model_).lp_.scale_.has_scaling == true) {
      __new_size = local_260 + ext_num_new_col;
      this_00 = &(pHVar11->model_).lp_.scale_.col;
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      auVar5 = _DAT_003c57d0;
      if (0 < ext_num_new_col) {
        iVar3 = ((HighsLp *)&local_330->num_col_)->num_col_;
        pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = local_338 - 1;
        auVar14._8_4_ = (int)lVar12;
        auVar14._0_8_ = lVar12;
        auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar12 = 0;
        auVar14 = auVar14 ^ _DAT_003c57d0;
        auVar15 = _DAT_003c57c0;
        do {
          auVar17 = auVar15 ^ auVar5;
          if ((bool)(~(auVar17._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar17._0_4_ ||
                      auVar14._4_4_ < auVar17._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar4 + lVar12 + (long)iVar3 * 8) = 0x3ff0000000000000;
          }
          if ((auVar17._12_4_ != auVar14._12_4_ || auVar17._8_4_ <= auVar14._8_4_) &&
              auVar17._12_4_ <= auVar14._12_4_) {
            *(undefined8 *)((long)pdVar4 + lVar12 + (long)iVar3 * 8 + 8) = 0x3ff0000000000000;
          }
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar16 + 2;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)(ext_num_new_col + 1U >> 1) << 4 != lVar12);
      }
      (pHVar11->model_).lp_.scale_.num_col = (HighsInt)__new_size;
      HighsSparseMatrix::applyRowScale((HighsSparseMatrix *)local_328,&(pHVar11->model_).lp_.scale_)
      ;
      HighsSparseMatrix::considerColScaling
                ((HighsSparseMatrix *)local_328,
                 (pHVar11->options_).super_HighsOptionsStruct.allowed_matrix_scale_factor,
                 (pHVar11->model_).lp_.scale_.col.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + (pHVar11->model_).lp_.num_col_);
    }
    if ((pHVar11->basis_).useful == true) {
      appendNonbasicColsToBasisInterface(pHVar11,ext_num_new_col);
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
    HighsLp::addColNames(local_330,&local_208,ext_num_new_col);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    (pHVar11->model_).lp_.num_col_ = (pHVar11->model_).lp_.num_col_ + ext_num_new_col;
    bVar7 = true;
    if ((pHVar11->model_).lp_.has_infinite_cost_ == false) {
      bVar7 = local_371;
    }
    (pHVar11->model_).lp_.has_infinite_cost_ = bVar7;
    invalidateModelStatusSolutionAndInfo(pHVar11);
    HEkk::addCols(&pHVar11->ekk_instance_,local_330,(HighsSparseMatrix *)local_328);
    if ((pHVar11->model_).hessian_.dim_ != 0) {
      completeHessian(((HighsLp *)&local_330->num_col_)->num_col_,&(pHVar11->model_).hessian_);
    }
  }
  else {
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_368,ext_a_start,ext_a_start + local_338,
               &local_372);
    piVar6 = local_318[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_318[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_368._M_dataplus._M_p;
    local_318[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_368._M_string_length;
    local_318[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)piVar6 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(piVar6);
    }
    if ((pointer)local_368._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<int,_std::allocator<int>_>::resize(local_318,(ulong)(ext_num_new_col + 1));
    *(HighsInt *)
     ((long)local_318[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + local_338 * 4) = ext_num_new_nz;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_368,ext_a_index,
               ext_a_index + (uint)ext_num_new_nz,&local_372);
    piVar6 = local_2e8;
    local_2e8 = (pointer)local_368._M_dataplus._M_p;
    piStack_2e0 = (pointer)local_368._M_string_length;
    piStack_2d8 = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    if (piVar6 != (pointer)0x0) {
      operator_delete(piVar6);
    }
    if ((pointer)local_368._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_368,ext_a_value,
               ext_a_value + (uint)ext_num_new_nz,(allocator_type *)&local_372);
    pdVar4 = local_2d0;
    local_2d0 = (pointer)local_368._M_dataplus._M_p;
    pdStack_2c8 = (pointer)local_368._M_string_length;
    pdStack_2c0 = (pointer)local_368.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = (pointer)0x0;
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity = 0;
    if (pdVar4 != (pointer)0x0) {
      operator_delete(pdVar4);
    }
    if (local_368._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    local_168.log_stream = local_340->log_stream;
    local_168.output_flag = local_340->output_flag;
    local_168.log_to_console = local_340->log_to_console;
    local_168.log_dev_level = local_340->log_dev_level;
    local_168.user_log_callback = local_340->user_log_callback;
    local_168.user_log_callback_data = local_340->user_log_callback_data;
    pfVar1 = &local_168.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,local_2b8);
    local_168.user_callback_active = *(bool *)(local_268 + 1);
    local_168.user_callback_data = *local_268;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"LP","");
    HVar9 = HighsSparseMatrix::assess
                      ((HighsSparseMatrix *)local_328,local_340,&local_1e8,
                       (pHVar11->options_).super_HighsOptionsStruct.small_matrix_value,
                       (pHVar11->options_).super_HighsOptionsStruct.large_matrix_value);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"assessMatrix","");
    HVar8 = interpretCallStatus(&local_168,HVar9,HVar8,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    pHVar11 = local_370;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_168.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_168.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    if (HVar8 != kError) goto LAB_00230503;
    HVar8 = kError;
  }
  HighsSparseMatrix::~HighsSparseMatrix((HighsSparseMatrix *)local_328);
  HVar9 = HVar8;
LAB_0023072c:
  if (local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_280.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_258.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar9;
}

Assistant:

HighsStatus Highs::addColsInterface(
    HighsInt ext_num_new_col, const double* ext_col_cost,
    const double* ext_col_lower, const double* ext_col_upper,
    HighsInt ext_num_new_nz, const HighsInt* ext_a_start,
    const HighsInt* ext_a_index, const double* ext_a_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsOptions& options = options_;
  if (ext_num_new_col < 0) return HighsStatus::kError;
  if (ext_num_new_nz < 0) return HighsStatus::kError;
  if (ext_num_new_col == 0) return HighsStatus::kOk;
  if (ext_num_new_col > 0)
    if (isColDataNull(options.log_options, ext_col_cost, ext_col_lower,
                      ext_col_upper))
      return HighsStatus::kError;
  if (ext_num_new_nz > 0)
    if (isMatrixDataNull(options.log_options, ext_a_start, ext_a_index,
                         ext_a_value))
      return HighsStatus::kError;

  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  HighsScale& scale = lp.scale_;
  bool& useful_basis = basis.useful;
  bool& lp_has_scaling = lp.scale_.has_scaling;

  // Check that if nonzeros are to be added then the model has a positive number
  // of rows
  if (lp.num_row_ <= 0 && ext_num_new_nz > 0) return HighsStatus::kError;

  // Record the new number of columns
  HighsInt newNumCol = lp.num_col_ + ext_num_new_col;

  HighsIndexCollection index_collection;
  index_collection.dimension_ = ext_num_new_col;
  index_collection.is_interval_ = true;
  index_collection.from_ = 0;
  index_collection.to_ = ext_num_new_col - 1;

  // Take a copy of the cost and bounds that can be normalised
  std::vector<double> local_colCost{ext_col_cost,
                                    ext_col_cost + ext_num_new_col};
  std::vector<double> local_colLower{ext_col_lower,
                                     ext_col_lower + ext_num_new_col};
  std::vector<double> local_colUpper{ext_col_upper,
                                     ext_col_upper + ext_num_new_col};

  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options, lp.num_col_, index_collection, local_colCost,
                  local_has_infinite_cost, options.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  // Assess the column bounds
  return_status = interpretCallStatus(
      options_.log_options,
      assessBounds(options, "Col", lp.num_col_, index_collection,
                   local_colLower, local_colUpper, options.infinite_bound),
      return_status, "assessBounds");
  if (return_status == HighsStatus::kError) return return_status;
  if (lp.user_bound_scale_) {
    // Assess and apply any user bound scaling
    if (!boundScaleOk(local_colLower, local_colUpper, lp.user_bound_scale_,
                      options.infinite_bound)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User bound scaling yields infinite bound\n");
      return HighsStatus::kError;
    }
    double bound_scale_value = std::pow(2, lp.user_bound_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++) {
      local_colLower[iCol] *= bound_scale_value;
      local_colUpper[iCol] *= bound_scale_value;
    }
  }
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  // Append the columns to the LP vectors and matrix
  appendColsToLpVectors(lp, ext_num_new_col, local_colCost, local_colLower,
                        local_colUpper);
  // Form a column-wise HighsSparseMatrix of the new matrix columns so
  // that is easy to handle and, if there are nonzeros, it can be
  // normalised
  HighsSparseMatrix local_a_matrix;
  local_a_matrix.num_col_ = ext_num_new_col;
  local_a_matrix.num_row_ = lp.num_row_;
  local_a_matrix.format_ = MatrixFormat::kColwise;
  if (ext_num_new_nz) {
    local_a_matrix.start_ = {ext_a_start, ext_a_start + ext_num_new_col};
    local_a_matrix.start_.resize(ext_num_new_col + 1);
    local_a_matrix.start_[ext_num_new_col] = ext_num_new_nz;
    local_a_matrix.index_ = {ext_a_index, ext_a_index + ext_num_new_nz};
    local_a_matrix.value_ = {ext_a_value, ext_a_value + ext_num_new_nz};
    // Assess the matrix rows
    return_status =
        interpretCallStatus(options_.log_options,
                            local_a_matrix.assess(options.log_options, "LP",
                                                  options.small_matrix_value,
                                                  options.large_matrix_value),
                            return_status, "assessMatrix");
    if (return_status == HighsStatus::kError) return return_status;
  } else {
    // No nonzeros so, whether the constraint matrix is column-wise or
    // row-wise, adding the empty matrix is trivial. Complete the
    // setup of an empty column-wise HighsSparseMatrix of the new
    // matrix columns
    local_a_matrix.start_.assign(ext_num_new_col + 1, 0);
  }
  // Append the columns to LP matrix
  lp.a_matrix_.addCols(local_a_matrix);
  if (lp_has_scaling) {
    // Extend the column scaling factors
    scale.col.resize(newNumCol);
    for (HighsInt iCol = 0; iCol < ext_num_new_col; iCol++)
      scale.col[lp.num_col_ + iCol] = 1.0;
    scale.num_col = newNumCol;
    // Apply the existing row scaling to the new columns
    local_a_matrix.applyRowScale(scale);
    // Consider applying column scaling to the new columns.
    local_a_matrix.considerColScaling(options.allowed_matrix_scale_factor,
                                      &scale.col[lp.num_col_]);
  }
  // Update the basis corresponding to new nonbasic columns
  if (useful_basis) appendNonbasicColsToBasisInterface(ext_num_new_col);

  // Possibly add column names
  lp.addColNames("", ext_num_new_col);

  // Increase the number of columns in the LP
  lp.num_col_ += ext_num_new_col;
  assert(lpDimensionsOk("addCols", lp, options.log_options));

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options.infinite_cost));

  // Deduce the consequences of adding new columns
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.addCols(lp, local_a_matrix);

  // Extend any Hessian with zeros on the diagonal
  if (this->model_.hessian_.dim_)
    completeHessian(lp.num_col_, this->model_.hessian_);
  return return_status;
}